

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# APFloat.cpp
# Opt level: O0

void __thiscall llvm::APFloat::Storage::Storage(Storage *this,IEEEFloat *F,fltSemantics *Semantics)

{
  fltSemantics *S;
  bool bVar1;
  APFloat local_80;
  IEEEFloat local_60;
  APFloat local_48;
  fltSemantics *local_28;
  fltSemantics *semantics;
  fltSemantics *Semantics_local;
  IEEEFloat *F_local;
  Storage *this_local;
  
  semantics = Semantics;
  Semantics_local = (fltSemantics *)F;
  F_local = (IEEEFloat *)this;
  bVar1 = usesLayout<llvm::detail::IEEEFloat>(Semantics);
  if (bVar1) {
    detail::IEEEFloat::IEEEFloat((IEEEFloat *)this,F);
  }
  else {
    bVar1 = usesLayout<llvm::detail::DoubleAPFloat>(semantics);
    if (!bVar1) {
      llvm_unreachable_internal
                ("Unexpected semantics",
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/lib/llvm/Support/APFloat.cpp"
                 ,0x114b);
    }
    local_28 = detail::IEEEFloat::getSemantics(F);
    S = semantics;
    detail::IEEEFloat::IEEEFloat(&local_60,F);
    APFloat(&local_48,&local_60,local_28);
    APFloat(&local_80,(fltSemantics *)semIEEEdouble);
    detail::DoubleAPFloat::DoubleAPFloat((DoubleAPFloat *)this,S,&local_48,&local_80);
    ~APFloat(&local_80);
    ~APFloat(&local_48);
    detail::IEEEFloat::~IEEEFloat(&local_60);
  }
  return;
}

Assistant:

APFloat::Storage::Storage(IEEEFloat F, const fltSemantics &Semantics) {
  if (usesLayout<IEEEFloat>(Semantics)) {
    new (&IEEE) IEEEFloat(std::move(F));
    return;
  }
  if (usesLayout<DoubleAPFloat>(Semantics)) {
    const auto& semantics = F.getSemantics();
    new (&Double)
        DoubleAPFloat(Semantics, APFloat(std::move(F), semantics),
                      APFloat(semIEEEdouble));
    return;
  }
  llvm_unreachable("Unexpected semantics");
}